

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O2

PreparedMessage *
uWS::WebSocket<true>::prepareMessage
          (char *data,size_t length,OpCode opCode,bool compressed,
          _func_void_void_ptr_void_ptr_bool_void_ptr *callback)

{
  PreparedMessage *pPVar1;
  char *dst;
  size_t sVar2;
  
  pPVar1 = (PreparedMessage *)operator_new(0x20);
  dst = (char *)operator_new__(length + 10);
  pPVar1->buffer = dst;
  sVar2 = WebSocketProtocol<true>::formatMessage(dst,data,length,opCode,length,compressed);
  pPVar1->length = sVar2;
  pPVar1->references = 1;
  pPVar1->callback = callback;
  return pPVar1;
}

Assistant:

typename WebSocket<isServer>::PreparedMessage *WebSocket<isServer>::prepareMessage(char *data, size_t length, OpCode opCode, bool compressed, void(*callback)(void *webSocket, void *data, bool cancelled, void *reserved)) {
    PreparedMessage *preparedMessage = new PreparedMessage;
    preparedMessage->buffer = new char[length + 10];
    preparedMessage->length = WebSocketProtocol<isServer>::formatMessage(preparedMessage->buffer, data, length, opCode, length, compressed);
    preparedMessage->references = 1;
    preparedMessage->callback = callback;
    return preparedMessage;
}